

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O1

void __thiscall fasttext::SoftmaxLoss::computeOutput(SoftmaxLoss *this,State *state)

{
  Vector *this_00;
  pointer pfVar1;
  pointer pfVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined8 uVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  uint uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  double dVar20;
  uint uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  float fVar24;
  
  this_00 = &state->output;
  Vector::mul(this_00,(((this->super_Loss).wo_)->
                      super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
              &state->hidden);
  pfVar2 = (state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar23 = ZEXT464((uint)*pfVar2);
  uVar16 = (uint)((ulong)((long)(state->output).data_.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pfVar2) >> 2);
  if (0 < (int)uVar16) {
    uVar15 = 0;
    do {
      auVar8 = vmaxss_avx(auVar23._0_16_,ZEXT416((uint)pfVar2[uVar15]));
      auVar23 = ZEXT1664(auVar8);
      uVar15 = uVar15 + 1;
    } while ((uVar16 & 0x7fffffff) != uVar15);
  }
  if ((int)uVar16 < 1) {
    fVar24 = 0.0;
  }
  else {
    fVar24 = 0.0;
    uVar15 = 0;
    uVar21 = auVar23._0_4_;
    do {
      dVar20 = exp((double)((this_00->data_).super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar15] - auVar23._0_4_));
      auVar23 = ZEXT464(uVar21);
      (this_00->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[uVar15] = (float)dVar20;
      fVar24 = fVar24 + (float)dVar20;
      uVar15 = uVar15 + 1;
    } while ((uVar16 & 0x7fffffff) != uVar15);
  }
  if (0 < (int)uVar16) {
    pfVar2 = (this_00->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    auVar17 = vpbroadcastq_avx512vl();
    auVar22._4_4_ = fVar24;
    auVar22._0_4_ = fVar24;
    auVar22._8_4_ = fVar24;
    auVar22._12_4_ = fVar24;
    auVar22._16_4_ = fVar24;
    auVar22._20_4_ = fVar24;
    auVar22._24_4_ = fVar24;
    auVar22._28_4_ = fVar24;
    uVar15 = 0;
    auVar9 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar10 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    do {
      auVar18 = vpbroadcastq_avx512vl();
      auVar19 = vpor_avx2(auVar18,auVar9);
      auVar18 = vpor_avx2(auVar18,auVar10);
      uVar11 = vpcmpuq_avx512vl(auVar18,auVar17,2);
      bVar14 = (byte)uVar11;
      uVar11 = vpcmpuq_avx512vl(auVar19,auVar17,2);
      bVar13 = (byte)uVar11;
      bVar12 = bVar13 << 4;
      pfVar1 = pfVar2 + uVar15;
      auVar19._4_4_ = (uint)((bVar14 & 2) >> 1) * (int)pfVar1[1];
      auVar19._0_4_ = (uint)(bVar14 & 1) * (int)*pfVar1;
      auVar19._8_4_ = (uint)((bVar14 & 4) >> 2) * (int)pfVar1[2];
      auVar19._12_4_ = (uint)((bVar14 & 0xf) >> 3) * (int)pfVar1[3];
      auVar19._16_4_ = (uint)(bVar13 & 1) * (int)pfVar1[4];
      auVar19._20_4_ = (uint)(bVar12 >> 5 & 1) * (int)pfVar1[5];
      auVar19._24_4_ = (uint)(bVar12 >> 6 & 1) * (int)pfVar1[6];
      auVar19._28_4_ = (uint)(bVar12 >> 7) * (int)pfVar1[7];
      auVar19 = vdivps_avx(auVar19,auVar22);
      pfVar1 = pfVar2 + uVar15;
      bVar3 = (bool)((bVar14 & 2) >> 1);
      bVar4 = (bool)((bVar14 & 4) >> 2);
      bVar5 = (bool)((bVar14 & 0xf) >> 3);
      bVar6 = (bool)(bVar12 >> 5 & 1);
      bVar7 = (bool)(bVar12 >> 6 & 1);
      *pfVar1 = (float)((uint)(bVar14 & 1) * auVar19._0_4_ |
                       (uint)!(bool)(bVar14 & 1) * (int)*pfVar1);
      pfVar1[1] = (float)((uint)bVar3 * auVar19._4_4_ | (uint)!bVar3 * (int)pfVar1[1]);
      pfVar1[2] = (float)((uint)bVar4 * auVar19._8_4_ | (uint)!bVar4 * (int)pfVar1[2]);
      pfVar1[3] = (float)((uint)bVar5 * auVar19._12_4_ | (uint)!bVar5 * (int)pfVar1[3]);
      pfVar1[4] = (float)((uint)(bVar13 & 1) * auVar19._16_4_ |
                         (uint)!(bool)(bVar13 & 1) * (int)pfVar1[4]);
      pfVar1[5] = (float)((uint)bVar6 * auVar19._20_4_ | (uint)!bVar6 * (int)pfVar1[5]);
      pfVar1[6] = (float)((uint)bVar7 * auVar19._24_4_ | (uint)!bVar7 * (int)pfVar1[6]);
      pfVar1[7] = (float)((uint)(bVar12 >> 7) * auVar19._28_4_ |
                         (uint)!(bool)(bVar12 >> 7) * (int)pfVar1[7]);
      uVar15 = uVar15 + 8;
    } while ((uVar16 + 7 & 0xfffffff8) != uVar15);
  }
  return;
}

Assistant:

void SoftmaxLoss::computeOutput(Model::State& state) const {
  Vector& output = state.output;
  output.mul(*wo_, state.hidden);
  real max = output[0], z = 0.0;
  int32_t osz = output.size();
  for (int32_t i = 0; i < osz; i++) {
    max = std::max(output[i], max);
  }
  for (int32_t i = 0; i < osz; i++) {
    output[i] = exp(output[i] - max);
    z += output[i];
  }
  for (int32_t i = 0; i < osz; i++) {
    output[i] /= z;
  }
}